

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt * __thiscall llvm::APInt::operator*=(APInt *this,APInt *RHS)

{
  APInt local_28;
  APInt *local_18;
  APInt *RHS_local;
  APInt *this_local;
  
  local_18 = RHS;
  RHS_local = this;
  if (this->BitWidth != RHS->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0xff,"APInt &llvm::APInt::operator*=(const APInt &)");
  }
  operator*(&local_28,this);
  operator=(this,&local_28);
  ~APInt(&local_28);
  return this;
}

Assistant:

APInt& APInt::operator*=(const APInt& RHS) {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  *this = *this * RHS;
  return *this;
}